

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void grid_data_as_text(grid_data *g,int *ap,wchar_t *cp,int *tap,wchar_t *tcp)

{
  wchar_t wVar1;
  byte bVar2;
  _Bool _Var3;
  monster_conflict *pmVar4;
  wchar_t local_64;
  monster_race *race;
  wchar_t dc;
  uint8_t da;
  monster *mon;
  wchar_t local_40;
  wchar_t wStack_3c;
  _Bool skip_objects;
  wchar_t c;
  wchar_t a;
  feature *feat;
  wchar_t *tcp_local;
  int *tap_local;
  wchar_t *cp_local;
  int *ap_local;
  grid_data *g_local;
  
  _c = f_info + g->f_idx;
  wStack_3c = (wchar_t)feat_x_attr[g->lighting][_c->fidx];
  local_40 = feat_x_char[g->lighting][_c->fidx];
  mon._7_1_ = false;
  feat = (feature *)tcp;
  tcp_local = tap;
  tap_local = cp;
  cp_local = ap;
  ap_local = (int *)g;
  if (use_graphics == L'\0') {
    grid_get_attr(g,&stack0xffffffffffffffc4);
  }
  *tcp_local = wStack_3c;
  *(wchar_t *)&feat->name = local_40;
  if ((*(long *)(ap_local + 4) != 0) && ((*(byte *)((long)ap_local + 0x22) & 1) == 0)) {
    mon._7_1_ = get_trap_graphics((chunk *)cave,(grid_data *)ap_local,&stack0xffffffffffffffc4,
                                  &local_40);
  }
  if (mon._7_1_ == false) {
    if ((*(byte *)((long)ap_local + 0x1a) & 1) == 0) {
      if ((*(byte *)((long)ap_local + 0x19) & 1) == 0) {
        if (*(long *)(ap_local + 2) != 0) {
          if ((*(byte *)((long)ap_local + 0x22) & 1) == 0) {
            if ((*(byte *)(ap_local + 6) & 1) == 0) {
              bVar2 = object_kind_attr(*(object_kind **)(ap_local + 2));
              wStack_3c = (wchar_t)bVar2;
              local_40 = object_kind_char(*(object_kind **)(ap_local + 2));
            }
            else {
              bVar2 = object_kind_attr(pile_kind);
              wStack_3c = (wchar_t)bVar2;
              local_40 = object_kind_char(pile_kind);
            }
          }
          else {
            hallucinatory_object(&stack0xffffffffffffffc4,&local_40);
          }
        }
      }
      else {
        bVar2 = object_kind_attr(unknown_item_kind);
        wStack_3c = (wchar_t)bVar2;
        local_40 = object_kind_char(unknown_item_kind);
      }
    }
    else {
      bVar2 = object_kind_attr(unknown_gold_kind);
      wStack_3c = (wchar_t)bVar2;
      local_40 = object_kind_char(unknown_gold_kind);
    }
  }
  if (*ap_local == 0) {
    if ((*(byte *)((long)ap_local + 0x21) & 1) != 0) {
      wStack_3c = (wchar_t)monster_x_attr[r_info->ridx];
      if ((((player->opts).opt[0x12] & 1U) != 0) && ((monster_x_attr[r_info->ridx] & 0x80) == 0)) {
        switch((long)(player->chp * 10) / (long)(int)player->mhp & 0xffffffff) {
        case 0:
        case 1:
        case 2:
          wStack_3c = L'\x04';
          break;
        case 3:
        case 4:
          wStack_3c = L'\f';
          break;
        case 5:
        case 6:
          wStack_3c = L'\x03';
          break;
        case 7:
        case 8:
          wStack_3c = L'\v';
          break;
        case 9:
        case 10:
          wStack_3c = L'\x01';
          break;
        default:
          wStack_3c = L'\x01';
        }
      }
      local_40 = monster_x_char[r_info->ridx];
    }
  }
  else if ((*(byte *)((long)ap_local + 0x22) & 1) == 0) {
    pmVar4 = cave_monster(cave,*ap_local);
    _Var3 = monster_is_camouflaged((monster *)pmVar4);
    if (!_Var3) {
      pmVar4 = cave_monster(cave,*ap_local);
      bVar2 = monster_x_attr[pmVar4->race->ridx];
      wVar1 = monster_x_char[pmVar4->race->ridx];
      if ((bVar2 & 0x80) == 0) {
        if ((((player->opts).opt[0x10] & 1U) == 0) ||
           (_Var3 = monster_is_shape_unique((monster *)pmVar4), !_Var3)) {
          _Var3 = flag_has_dbg(pmVar4->race->flags,0xc,10,"mon->race->flags","RF_ATTR_MULTI");
          if ((_Var3) ||
             ((_Var3 = flag_has_dbg(pmVar4->race->flags,0xc,0xb,"mon->race->flags","RF_ATTR_FLICKER"
                                   ), _Var3 ||
              (_Var3 = flag_has_dbg(pmVar4->race->flags,0xc,8,"mon->race->flags","RF_ATTR_RAND"),
              _Var3)))) {
            if (pmVar4->attr != '\0') {
              bVar2 = pmVar4->attr;
            }
            local_64 = (wchar_t)bVar2;
            wStack_3c = local_64;
          }
          else {
            _Var3 = flags_test(pmVar4->race->flags,0xc,9,7,0);
            if (_Var3) {
              if ((wStack_3c & 0x80U) == 0) {
                _Var3 = flag_has_dbg(pmVar4->race->flags,0xc,7,"mon->race->flags","RF_CHAR_CLEAR");
                if ((_Var3) &&
                   (_Var3 = flag_has_dbg(pmVar4->race->flags,0xc,9,"mon->race->flags",
                                         "RF_ATTR_CLEAR"), wVar1 = local_40, !_Var3)) {
                  wStack_3c = (wchar_t)bVar2;
                }
              }
              else {
                wStack_3c = (wchar_t)bVar2;
              }
            }
            else {
              wStack_3c = (wchar_t)bVar2;
              wVar1 = monster_x_char[pmVar4->race->ridx];
            }
          }
        }
        else {
          wStack_3c = L'\x11';
        }
      }
      else {
        wStack_3c = (wchar_t)bVar2;
      }
      local_40 = wVar1;
      pmVar4->attr = (uint8_t)wStack_3c;
    }
  }
  else {
    hallucinatory_monster(&stack0xffffffffffffffc4,&local_40);
  }
  *cp_local = wStack_3c;
  *tap_local = local_40;
  return;
}

Assistant:

void grid_data_as_text(struct grid_data *g, int *ap, wchar_t *cp, int *tap,
					   wchar_t *tcp)
{
	struct feature *feat = &f_info[g->f_idx];

	int a = feat_x_attr[g->lighting][feat->fidx];
	wchar_t c = feat_x_char[g->lighting][feat->fidx];
	bool skip_objects = false;

	/* Get the colour for ASCII */
	if (use_graphics == GRAPHICS_NONE)
		grid_get_attr(g, &a);

	/* Save the terrain info for the transparency effects */
	(*tap) = a;
	(*tcp) = c;

	/* There is a trap in this grid, and we are not hallucinating */
	if (g->trap && (!g->hallucinate)) {
	    /* Change graphics to indicate visible traps, skip objects if a web */
	    skip_objects = get_trap_graphics(cave, g, &a, &c);
	}

	if (!skip_objects) {
		/* If there's an object, deal with that. */
		if (g->unseen_money) {

			/* $$$ gets an orange star*/
			a = object_kind_attr(unknown_gold_kind);
			c = object_kind_char(unknown_gold_kind);

		} else if (g->unseen_object) {

			/* Everything else gets a red star */
			a = object_kind_attr(unknown_item_kind);
			c = object_kind_char(unknown_item_kind);

		} else if (g->first_kind) {
			if (g->hallucinate) {
				/* Just pick a random object to display. */
				hallucinatory_object(&a, &c);
			} else if (g->multiple_objects) {
				/* Get the "pile" feature instead */
				a = object_kind_attr(pile_kind);
				c = object_kind_char(pile_kind);
			} else {
				/* Normal attr and char */
				a = object_kind_attr(g->first_kind);
				c = object_kind_char(g->first_kind);
			}
		}
	}

	/* Handle monsters, the player and trap borders */
	if (g->m_idx > 0) {
		if (g->hallucinate) {
			/* Just pick a random monster to display. */
			hallucinatory_monster(&a, &c);
		} else if (!monster_is_camouflaged(cave_monster(cave, g->m_idx)))	{
			struct monster *mon = cave_monster(cave, g->m_idx);

			uint8_t da;
			wchar_t dc;

			/* Desired attr & char */
			da = monster_x_attr[mon->race->ridx];
			dc = monster_x_char[mon->race->ridx];

			/* Special handling of attrs and/or chars */
			if (da & 0x80) {
				/* Special attr/char codes */
				a = da;
				c = dc;
			} else if (OPT(player, purple_uniques) && 
					monster_is_shape_unique(mon)) {
				/* Turn uniques purple if desired (violet, actually) */
				a = COLOUR_VIOLET;
				c = dc;
			} else if (rf_has(mon->race->flags, RF_ATTR_MULTI) ||
					   rf_has(mon->race->flags, RF_ATTR_FLICKER) ||
					   rf_has(mon->race->flags, RF_ATTR_RAND)) {
				/* Multi-hued monster */
				a = mon->attr ? mon->attr : da;
				c = dc;
			} else if (!flags_test(mon->race->flags, RF_SIZE,
								   RF_ATTR_CLEAR, RF_CHAR_CLEAR, FLAG_END)) {
				/* Normal monster (not "clear" in any way) */
				a = da;
				/* Desired attr & char. da is not used, should a be set to it?*/
				/*da = monster_x_attr[mon->race->ridx];*/
				dc = monster_x_char[mon->race->ridx];
				c = dc;
			} else if (a & 0x80) {
				/* Hack -- Bizarre grid under monster */
				a = da;
				c = dc;
			} else if (!rf_has(mon->race->flags, RF_CHAR_CLEAR)) {
				/* Normal char, Clear attr, monster */
				c = dc;
			} else if (!rf_has(mon->race->flags, RF_ATTR_CLEAR)) {
				/* Normal attr, Clear char, monster */
				a = da;
			}

			/* Store the drawing attr so we can use it elsewhere */
			mon->attr = a;
		}
	} else if (g->is_player) {
		struct monster_race *race = &r_info[0];

		/* Get the "player" attr */
		a = monster_x_attr[race->ridx];
		if ((OPT(player, hp_changes_color)) && !(a & 0x80)) {
			switch(player->chp * 10 / player->mhp)
			{
			case 10:
			case  9: 
			{
				a = COLOUR_WHITE; 
				break;
			}
			case  8:
			case  7:
			{
				a = COLOUR_YELLOW;
				break;
			}
			case  6:
			case  5:
			{
				a = COLOUR_ORANGE;
				break;
			}
			case  4:
			case  3:
			{
				a = COLOUR_L_RED;
				break;
			}
			case  2:
			case  1:
			case  0:
			{
				a = COLOUR_RED;
				break;
			}
			default:
			{
				a = COLOUR_WHITE;
				break;
			}
			}
		}

		/* Get the "player" char */
		c = monster_x_char[race->ridx];
	}

	/* Result */
	(*ap) = a;
	(*cp) = c;
}